

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

int __thiscall
CCharmapToUniASCII::mapchar(CCharmapToUniASCII *this,wchar_t *ch,char **p,size_t *len)

{
  byte *pbVar1;
  size_t *len_local;
  char **p_local;
  wchar_t *ch_local;
  CCharmapToUniASCII *this_local;
  int local_4;
  
  if (*len == 0) {
    local_4 = 0;
  }
  else {
    pbVar1 = (byte *)*p;
    *p = (char *)(pbVar1 + 1);
    *ch = (uint)*pbVar1;
    if (L'\x7f' < *ch) {
      *ch = L'�';
    }
    *len = *len - 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

virtual int mapchar(wchar_t &ch, const char *&p, size_t &len)
    {
        if (len >= 1)
        {
            /* map the character */
            ch = (unsigned char)*p++;

            /* substitude U+FFFD for any invalid character */
            if (ch > 127)
                ch = 0xFFFD;

            /* deduct it from the length */
            len -= 1;

            /* success */
            return TRUE;
        }
        else
            return FALSE;
    }